

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int local_1c;
  int pc;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  if ((eVar1 == VTRUE) || (eVar1 - VK < 2)) {
    local_1c = -1;
  }
  else if (eVar1 == VJMP) {
    invertjump(fs,e);
    local_1c = (e->u).s.info;
  }
  else {
    local_1c = jumponcond(fs,e,0);
  }
  luaK_concat(fs,&e->f,local_1c);
  luaK_patchtohere(fs,e->t);
  e->t = -1;
  return;
}

Assistant:

static void luaK_goiftrue(FuncState*fs,expdesc*e){
int pc;
luaK_dischargevars(fs,e);
switch(e->k){
case VK:case VKNUM:case VTRUE:{
pc=(-1);
break;
}
case VJMP:{
invertjump(fs,e);
pc=e->u.s.info;
break;
}
default:{
pc=jumponcond(fs,e,0);
break;
}
}
luaK_concat(fs,&e->f,pc);
luaK_patchtohere(fs,e->t);
e->t=(-1);
}